

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerouteRunner.cpp
# Opt level: O0

void __thiscall TracerouteRunner::fetch_results(TracerouteRunner *this)

{
  array<char,_1024UL> *this_00;
  bool bVar1;
  char *pcVar2;
  FILE *pFVar3;
  runtime_error *this_01;
  pointer __s;
  size_type sVar4;
  pointer local_460;
  _func_int__IO_FILE_ptr *local_458 [3];
  undefined1 local_440 [8];
  unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> pipe;
  string cmd;
  array<char,_1024UL> buffer;
  TracerouteRunner *this_local;
  
  memset((void *)((long)&cmd.field_2 + 8),0,0x400);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &pipe._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                  super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                  super__Head_base<0UL,__IO_FILE_*,_false>,"traceroute ",&this->network_address);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pFVar3 = popen(pcVar2,"r");
  local_458[0] = pclose;
  std::unique_ptr<_IO_FILE,int(*)(_IO_FILE*)>::unique_ptr<int(*)(_IO_FILE*),void>
            ((unique_ptr<_IO_FILE,int(*)(_IO_FILE*)> *)local_440,(pointer)pFVar3,local_458);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_440);
  if (bVar1) {
    while( true ) {
      this_00 = (array<char,_1024UL> *)((long)&cmd.field_2 + 8);
      __s = std::array<char,_1024UL>::data(this_00);
      sVar4 = std::array<char,_1024UL>::size(this_00);
      pFVar3 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                 ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_440);
      pcVar2 = fgets(__s,(int)sVar4,pFVar3);
      if (pcVar2 == (char *)0x0) break;
      std::mutex::lock(&this->mutex_results);
      local_460 = std::array<char,_1024UL>::data((array<char,_1024UL> *)((long)&cmd.field_2 + 8));
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,
                 &local_460);
      std::mutex::unlock(&this->mutex_results);
    }
    this->read_complete = true;
    std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::~unique_ptr
              ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_440);
    std::__cxx11::string::~string
              ((string *)
               &pipe._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                super__Head_base<0UL,__IO_FILE_*,_false>);
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"popen() failed!");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void TracerouteRunner::fetch_results() {
	std::array<char, 1024> buffer {};
	const std::string cmd = "traceroute " + this->network_address;

	std::unique_ptr<FILE, decltype(&pclose)> pipe(popen(cmd.c_str(), "r"), pclose);
	if (!pipe) {
		throw std::runtime_error("popen() failed!");
	}

	while (fgets(buffer.data(), buffer.size(), pipe.get()) != nullptr) {
		this->mutex_results.lock();
		this->results.emplace_back(buffer.data());
		this->mutex_results.unlock();
	}

	this->read_complete = true;
}